

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int luv_pipe_connect(lua_State *L)

{
  int callback_ref;
  uv_pipe_t *handle;
  char *name;
  uv_connect_t *req;
  luv_req_t *plVar1;
  int in_ESI;
  
  handle = luv_check_pipe(L,in_ESI);
  name = luaL_checklstring(L,2,(size_t *)0x0);
  callback_ref = luv_check_continuation(L,3);
  req = (uv_connect_t *)lua_newuserdata(L,0x60);
  plVar1 = luv_setup_req(L,callback_ref);
  req->data = plVar1;
  uv_pipe_connect(req,handle,name,luv_connect_cb);
  return 1;
}

Assistant:

static int luv_pipe_connect(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_pipe_t* handle = luv_check_pipe(L, 1);
  const char* name = luaL_checkstring(L, 2);
  int ref = luv_check_continuation(L, 3);
  uv_connect_t* req = (uv_connect_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  uv_pipe_connect(req, handle, name, luv_connect_cb);
  return 1;
}